

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int copyPayload(void *pPayload,void *pBuf,int nByte,int eOp,DbPage *pDbPage)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  int rc;
  PgHdr *in_stack_ffffffffffffffc8;
  
  if (in_ECX == 0) {
    memcpy(in_RSI,in_RDI,(long)in_EDX);
  }
  else {
    iVar1 = sqlite3PagerWrite(in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return iVar1;
    }
    memcpy(in_RDI,in_RSI,(long)in_EDX);
  }
  return 0;
}

Assistant:

static int copyPayload(
  void *pPayload,           /* Pointer to page data */
  void *pBuf,               /* Pointer to buffer */
  int nByte,                /* Number of bytes to copy */
  int eOp,                  /* 0 -> copy from page, 1 -> copy to page */
  DbPage *pDbPage           /* Page containing pPayload */
){
  if( eOp ){
    /* Copy data from buffer to page (a write operation) */
    int rc = sqlite3PagerWrite(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    memcpy(pPayload, pBuf, nByte);
  }else{
    /* Copy data from page to buffer (a read operation) */
    memcpy(pBuf, pPayload, nByte);
  }
  return SQLITE_OK;
}